

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_131c27::EchoState::update
          (EchoState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  uint uVar1;
  element_type_conflict2 (*arr) [16];
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  array<float,_16UL> coeffs1;
  array<float,_16UL> coeffs0;
  float angle;
  float gainhf;
  float frequency;
  ALCdevice *device;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  undefined4 uVar2;
  BiquadFilterR<float> *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff2c;
  float *in_stack_ffffffffffffff30;
  MixParams *in_stack_ffffffffffffff38;
  span<float,_16UL> in_stack_ffffffffffffff40;
  
  al::intrusive_ptr<ALCdevice>::get((intrusive_ptr<ALCdevice> *)(in_RSI + 0x200));
  uVar1 = float2uint(0.0);
  uVar1 = maxu(uVar1,1);
  *(ulong *)(in_RDI + 0x38) = (ulong)uVar1;
  uVar1 = float2uint(0.0);
  *(ulong *)(in_RDI + 0x40) = (ulong)uVar1 + *(long *)(in_RDI + 0x38);
  maxf(1.0 - *(float *)(in_RCX + 8),0.0625);
  BiquadFilterR<float>::setParamsFromSlope
            (in_stack_ffffffffffffff10,(BiquadType)((ulong)in_RDI >> 0x20),(float)in_RDI,
             in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
  *(undefined4 *)(in_RDI + 0x16c) = *(undefined4 *)(in_RCX + 0xc);
  std::asin((double)(ulong)*(uint *)(in_RCX + 0x10));
  CalcAngleCoeffs((float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                  SUB84(in_stack_ffffffffffffff10,0),(float)((ulong)in_RDI >> 0x20));
  CalcAngleCoeffs((float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                  SUB84(in_stack_ffffffffffffff10,0),(float)((ulong)in_RDI >> 0x20));
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_R8 + 0x80);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_R8 + 0x88);
  arr = (element_type_conflict2 (*) [16])
        std::array<float,_16UL>::data((array<float,_16UL> *)0x1d758c);
  uVar2 = *(undefined4 *)(in_RDX + 0x98);
  al::span<float,_16UL>::span((span<float,_16UL> *)CONCAT44(uVar2,in_stack_ffffffffffffff00),arr);
  ComputePanGains(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                  in_stack_ffffffffffffff40);
  std::array<float,_16UL>::data((array<float,_16UL> *)0x1d75ef);
  al::span<float,_16UL>::span((span<float,_16UL> *)CONCAT44(uVar2,in_stack_ffffffffffffff00),arr);
  ComputePanGains(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                  in_stack_ffffffffffffff40);
  return;
}

Assistant:

void EchoState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    const auto frequency = static_cast<float>(device->Frequency);

    mTap[0].delay = maxu(float2uint(props->Echo.Delay*frequency + 0.5f), 1);
    mTap[1].delay = float2uint(props->Echo.LRDelay*frequency + 0.5f) + mTap[0].delay;

    const float gainhf{maxf(1.0f - props->Echo.Damping, 0.0625f)}; /* Limit -24dB */
    mFilter.setParamsFromSlope(BiquadType::HighShelf, LOWPASSFREQREF/frequency, gainhf, 1.0f);

    mFeedGain = props->Echo.Feedback;

    /* Convert echo spread (where 0 = center, +/-1 = sides) to angle. */
    const float angle{std::asin(props->Echo.Spread)};

    const auto coeffs0 = CalcAngleCoeffs(-angle, 0.0f, 0.0f);
    const auto coeffs1 = CalcAngleCoeffs( angle, 0.0f, 0.0f);

    mOutTarget = target.Main->Buffer;
    ComputePanGains(target.Main, coeffs0.data(), slot->Gain, mGains[0].Target);
    ComputePanGains(target.Main, coeffs1.data(), slot->Gain, mGains[1].Target);
}